

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# City.cpp
# Opt level: O0

uint128 CityHashCrc128WithSeed(char *s,size_t len,uint128 seed)

{
  uint64 uVar1;
  uint64 uVar2;
  ulong in_RSI;
  uint64 v;
  uint64 u;
  uint64 result [4];
  size_t in_stack_000000a8;
  char *in_stack_000000b0;
  undefined1 in_stack_000000b8 [16];
  size_t in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  long local_68;
  long local_60;
  uint128 local_20;
  uint128 local_10;
  
  if (in_RSI < 0x385) {
    local_10 = CityHash128WithSeed(in_stack_000000b0,in_stack_000000a8,(uint128)in_stack_000000b8);
  }
  else {
    CityHashCrc256(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(uint64 *)0x1b32f9);
    uVar1 = Uint128High64(&local_20);
    uVar1 = uVar1 + local_68;
    uVar2 = Uint128Low64(&local_20);
    uVar2 = uVar2 + local_60;
    HashLen16(uVar1,uVar2);
    Rotate(uVar2,0x20);
    HashLen16(uVar1,uVar2);
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
              (&local_10,(unsigned_long *)&stack0xffffffffffffff80,
               (unsigned_long *)&stack0xffffffffffffff78);
  }
  return local_10;
}

Assistant:

uint128 CityHashCrc128WithSeed(const char *s, size_t len, uint128 seed) {
  if (len <= 900) {
    return CityHash128WithSeed(s, len, seed);
  } else {
    uint64 result[4];
    CityHashCrc256(s, len, result);
    uint64 u = Uint128High64(seed) + result[0];
    uint64 v = Uint128Low64(seed) + result[1];
    return uint128(HashLen16(u, v + result[2]),
                   HashLen16(Rotate(v, 32), u * k0 + result[3]));
  }
}